

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int mbedtls_dhm_self_test(int verbose)

{
  undefined1 local_108 [8];
  mbedtls_dhm_context dhm;
  int ret;
  int verbose_local;
  
  dhm.pX.p._4_4_ = verbose;
  mbedtls_dhm_init((mbedtls_dhm_context *)local_108);
  if (dhm.pX.p._4_4_ != 0) {
    printf("  DHM parameter load: ");
  }
  dhm.pX.p._0_4_ =
       mbedtls_dhm_parse_dhm
                 ((mbedtls_dhm_context *)local_108,
                  (uchar *)
                  "-----BEGIN DH PARAMETERS-----\r\nMIGHAoGBAJ419DBEOgmQTzo5qXl5fQcN9TN455wkOL7052HzxxRVMyhYmwQcgJvh\r\n1sa18fyfR9OiVEMYglOpkqVoGLN7qd5aQNNi5W7/C+VBdHTBJcGZJyyP5B3qcz32\r\n9mLJKudlVudV0Qxk5qUJaPZ/xupz0NyoVpviuiBOI1gNi8ovSXWzAgEC\r\n-----END DH PARAMETERS-----\r\n"
                  ,0xfb);
  if ((int)dhm.pX.p == 0) {
    if (dhm.pX.p._4_4_ != 0) {
      printf("passed\n\n");
    }
  }
  else {
    if (dhm.pX.p._4_4_ != 0) {
      printf("failed\n");
    }
    dhm.pX.p._0_4_ = 1;
  }
  mbedtls_dhm_free((mbedtls_dhm_context *)local_108);
  return (int)dhm.pX.p;
}

Assistant:

int mbedtls_dhm_self_test( int verbose )
{
    int ret;
    mbedtls_dhm_context dhm;

    mbedtls_dhm_init( &dhm );

    if( verbose != 0 )
        mbedtls_printf( "  DHM parameter load: " );

    if( ( ret = mbedtls_dhm_parse_dhm( &dhm,
                    (const unsigned char *) mbedtls_test_dhm_params,
                    mbedtls_test_dhm_params_len ) ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto exit;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n\n" );

exit:
    mbedtls_dhm_free( &dhm );

    return( ret );
}